

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O0

bool __thiscall capnp::_::ListReader::getDataElement<bool>(ListReader *this,ElementCount index)

{
  byte bVar1;
  uint uVar2;
  byte *b;
  uint bindex;
  ElementCount index_local;
  ListReader *this_local;
  
  bVar1 = this->ptr[index >> 3];
  uVar2 = unbound<unsigned_int>(1 << ((byte)index & 7));
  return (bVar1 & uVar2) != 0;
}

Assistant:

inline bool ListReader::getDataElement<bool>(ElementCount index) const {
  // Ignore step for bit lists because bit lists cannot be upgraded to struct lists.
  auto bindex = index * (ONE * BITS / ELEMENTS);
  const byte* b = ptr + bindex / BITS_PER_BYTE;
  return (*reinterpret_cast<const uint8_t*>(b) &
      unbound(ONE << (bindex % BITS_PER_BYTE / BITS))) != 0;
}